

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

void __thiscall
TPZFMatrix<long>::TimesBetaPlusZ(TPZFMatrix<long> *this,long beta,TPZFMatrix<long> *z)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  long *plVar5;
  
  plVar4 = this->fElem;
  plVar1 = plVar4 + (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol *
                    (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
  plVar5 = z->fElem;
  for (; plVar4 < plVar1; plVar4 = plVar4 + 1) {
    lVar2 = *plVar4;
    *plVar4 = lVar2 * beta;
    lVar3 = *plVar5;
    plVar5 = plVar5 + 1;
    *plVar4 = lVar2 * beta + lVar3;
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::TimesBetaPlusZ(const TVar beta,const TPZFMatrix<TVar> &z) {
    // #ifdef USING_ATLAS
    // 	int size = fRow*fCol;
    // 	cblas_dscal(size,beta,fElem,1);
    // 	cblas_daxpy(size,1.,z.fElem,1,fElem,1);
    // #else
    
    TVar * pt = fElem,  *ptlast = fElem + this->fRow*this->fCol;
    TVar * pz = z.fElem;
    //	while(pt < ptlast) *pt++ *= (beta) + *pz++;
    while(pt < ptlast) {
        *pt *= (beta);
        *pt++ += *pz++;
    }
    // #endif
}